

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall
pbrt::BinaryWriter::write<pbrt::Camera>(BinaryWriter *this,shared_ptr<pbrt::Camera> *t)

{
  int32_t local_24;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Camera,void>
            (local_20,&t->super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>);
  local_24 = serialize(this,(SP *)local_20);
  write<int>(this,&local_24);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

void write(std::shared_ptr<T> t)
    {
      write(serialize(t));
    }